

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenFieldsNumber(CppGenerator *this,StructDef *struct_def)

{
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  allocator<char> local_59;
  string local_58;
  FieldDef **local_30;
  FieldDef **local_28;
  difference_type local_20;
  difference_type non_deprecated_field_count;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  non_deprecated_field_count = (difference_type)struct_def;
  struct_def_local = (StructDef *)this;
  local_28 = (FieldDef **)
             std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (&(struct_def->fields).vec);
  local_30 = (FieldDef **)
             std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                       ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *
                        )(non_deprecated_field_count + 0xf8));
  local_20 = std::
             count_if<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef*const*,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,flatbuffers::cpp::CppGenerator::GenFieldsNumber(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const*)_1_>
                       (local_28,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"FIELD_COUNT",&local_59);
  std::__cxx11::to_string(&local_90,local_20);
  CodeWriter::SetValue(&this->code_,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"  static constexpr size_t fields_number = {{FIELD_COUNT}};",
             &local_b1);
  CodeWriter::operator+=(&this->code_,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  return;
}

Assistant:

void GenFieldsNumber(const StructDef &struct_def) {
    const auto non_deprecated_field_count = std::count_if(
        struct_def.fields.vec.begin(), struct_def.fields.vec.end(),
        [](const FieldDef *field) { return !field->deprecated; });
    code_.SetValue(
        "FIELD_COUNT",
        std::to_string(static_cast<long long>(non_deprecated_field_count)));
    code_ += "  static constexpr size_t fields_number = {{FIELD_COUNT}};";
  }